

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellLinkAndJumpListHandler.cpp
# Opt level: O0

void __thiscall
ShellLinkAndJumpListHandler::ShellLinkAndJumpListHandler
          (ShellLinkAndJumpListHandler *this,string *filePath)

{
  bool bVar1;
  ostream *poVar2;
  ReadStream *this_00;
  string local_38 [32];
  string *local_18;
  string *filePath_local;
  ShellLinkAndJumpListHandler *this_local;
  
  this->countOfShellLinkWithErrors = 0;
  this->countOfShellLink = 0;
  this->startPosition = 0;
  this->fileIsOpen = false;
  local_18 = filePath;
  filePath_local = (string *)this;
  poVar2 = std::operator<<((ostream *)&std::cout,"File:                               ");
  poVar2 = std::operator<<(poVar2,(string *)filePath);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  this_00 = (ReadStream *)operator_new(0x210);
  std::__cxx11::string::string(local_38,(string *)filePath);
  ReadStream::ReadStream(this_00,(string *)local_38);
  this->rs = this_00;
  std::__cxx11::string::~string(local_38);
  bVar1 = ReadStream::isFileOpen(this->rs);
  if (bVar1) {
    this->fileIsOpen = true;
  }
  return;
}

Assistant:

ShellLinkAndJumpListHandler::ShellLinkAndJumpListHandler(std::string filePath) {
    cout << "File:                               " << filePath << endl << endl;
    rs = new ReadStream(filePath);
    if(rs->isFileOpen())
        fileIsOpen = true;
}